

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O1

RK_S32 h264e_slice_write(H264eSlice *slice,void *p,RK_U32 size)

{
  int iVar1;
  RK_U8 *tmp;
  MppWriteCtx *s;
  int iVar2;
  long lVar3;
  MppWriteCtx stream;
  char log [256];
  MppWriteCtx MStack_168;
  char local_138 [264];
  
  mpp_writer_init(&MStack_168,p,size);
  h264e_slice_write_header(slice,&MStack_168);
  if (((byte)h264e_debug & 0x40) != 0) {
    builtin_strncpy(local_138,"sw stream: ",0xc);
    iVar2 = 0xb;
    lVar3 = 0;
    do {
      iVar1 = sprintf(local_138 + iVar2,"%02x ",(ulong)*(byte *)((long)p + lVar3));
      iVar2 = iVar2 + iVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    (local_138 + iVar2)[0] = '\n';
    (local_138 + iVar2)[1] = '\0';
    if (((byte)h264e_debug & 0x40) != 0) {
      _mpp_log_l(4,"h264e_slice",local_138,"h264e_slice_write");
    }
  }
  return MStack_168.buffered_bits + MStack_168.byte_cnt * 8;
}

Assistant:

RK_S32 h264e_slice_write(H264eSlice *slice, void *p, RK_U32 size)
{
    MppWriteCtx stream;
    MppWriteCtx *s = &stream;
    RK_S32 bitCnt = 0;

    mpp_writer_init(s, p, size);

    h264e_slice_write_header(slice, s);

    bitCnt = s->buffered_bits + s->byte_cnt * 8;

    // update on cabac mode
    if (slice->entropy_coding_mode)
        bitCnt = s->buffered_bits + s->byte_cnt * 8;

    if (h264e_debug & H264E_DBG_SLICE) {
        RK_S32 i;
        RK_U8 *tmp = p;
        RK_S32 pos = 0;
        char log[256];

        pos = sprintf(log + pos, "sw stream: ");
        for (i = 0; i < 16; i ++) {
            pos += sprintf(log + pos, "%02x ", tmp[i]);
        }
        pos += sprintf(log + pos, "\n");
        h264e_dbg_slice(log);
    }

    return bitCnt;
}